

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu_dlib.cpp
# Opt level: O1

void dlib::cpu::resize_bilinear
               (tensor *dest,longlong dest_row_stride,longlong dest_channel_stride,tensor *src,
               longlong src_row_stride,longlong src_channel_stride)

{
  thread_pool_implementation *this;
  task_state_type *ptVar1;
  undefined8 *puVar2;
  bool bVar3;
  int iVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  thread_pool *ptVar5;
  unsigned_long uVar6;
  long lVar7;
  pthread_t id;
  long lVar8;
  code *pcVar9;
  uint64 uVar10;
  ostream *poVar11;
  fatal_error *pfVar12;
  long i;
  long lVar13;
  long lVar14;
  long lVar15;
  ostringstream dlib_o_out;
  float *d;
  float *s;
  string local_240;
  undefined8 ***local_220;
  code *local_218;
  long local_210;
  long local_208;
  thread_pool *local_200;
  long local_1f8;
  long local_1f0;
  long local_1e8;
  longlong local_1e0;
  longlong local_1d8;
  longlong local_1d0;
  longlong local_1c8;
  undefined8 *local_1c0;
  longlong *local_1b8;
  tensor *local_1b0;
  longlong *local_1a8;
  undefined8 *local_1a0;
  longlong *local_198;
  tensor *local_190;
  longlong *local_188;
  undefined8 local_48;
  undefined8 local_40;
  undefined8 **local_38;
  
  local_1e0 = src_channel_stride;
  local_1d8 = src_row_stride;
  local_1d0 = dest_channel_stride;
  local_1c8 = dest_row_stride;
  if (dest == src) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1c0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1c0,"\n\nError detected at line ",0x19);
    poVar11 = (ostream *)std::ostream::operator<<((ostream *)&local_1c0,0x90c);
    std::__ostream_insert<char,std::char_traits<char>>(poVar11,".\n",2);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1c0,"Error detected in file ",0x17);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1c0,
               "/workspace/llm4binary/github/license_c_cmakelists/arrufat[P]dlib-pytorch-benchmark/external/dlib/dlib/cuda/cpu_dlib.cpp"
               ,0x77);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1c0,".\n",2);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1c0,"Error detected in function ",0x1b);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1c0,
               "void dlib::cpu::resize_bilinear(tensor &, long long, long long, const tensor &, long long, long long)"
               ,0x65);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1c0,".\n\n",3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1c0,"Failing expression was ",0x17);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1c0,"is_same_object(dest, src)==false",0x20);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1c0,".\n",2);
    *(uint *)((long)&local_1a8 + local_1c0[-3]) = *(uint *)((long)&local_1a8 + local_1c0[-3]) | 1;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1c0,"",0);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1c0,"\n",1);
    pfVar12 = (fatal_error *)__cxa_allocate_exception(0x30);
    std::__cxx11::stringbuf::str();
    fatal_error::fatal_error(pfVar12,EBROKEN_ASSERT,&local_240);
    __cxa_throw(pfVar12,&fatal_error::typeinfo,error::~error);
  }
  if (dest->m_n == src->m_n) {
    if (dest->m_k == src->m_k) {
      if ((dest->m_size != 0) && (src->m_size != 0)) {
        iVar4 = (*src->_vptr_tensor[2])(src);
        local_40 = CONCAT44(extraout_var,iVar4);
        iVar4 = (*dest->_vptr_tensor[3])(dest);
        local_48 = CONCAT44(extraout_var_00,iVar4);
        local_1a0 = &local_48;
        lVar14 = dest->m_n * dest->m_k;
        local_1b8 = &local_1e0;
        local_1a8 = &local_1d8;
        local_198 = &local_1d0;
        local_188 = &local_1c8;
        local_1c0 = &local_40;
        local_1b0 = src;
        local_190 = dest;
        ptVar5 = default_thread_pool();
        local_220 = &local_38;
        local_218 = impl::
                    helper_parallel_for_funct<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/arrufat[P]dlib-pytorch-benchmark/external/dlib/dlib/cuda/cpu_dlib.cpp:2326:58)>
                    ::run;
        local_210 = 0;
        local_38 = &local_1c0;
        uVar6 = thread_pool_implementation::num_threads_in_pool
                          ((ptVar5->impl).
                           super___shared_ptr<dlib::thread_pool_implementation,_(__gnu_cxx::_Lock_policy)2>
                           ._M_ptr);
        if (uVar6 == 0) {
          if (0 < lVar14) {
            lVar8 = 0;
            do {
              pcVar9 = local_218;
              if (((ulong)local_218 & 1) != 0) {
                pcVar9 = *(code **)(local_218 + *(long *)((long)local_220 + local_210) + -1);
              }
              (*pcVar9)((long *)((long)local_220 + local_210),lVar8);
              lVar8 = lVar8 + 1;
            } while (lVar14 - lVar8 != 0);
          }
        }
        else {
          uVar6 = thread_pool_implementation::num_threads_in_pool
                            ((ptVar5->impl).
                             super___shared_ptr<dlib::thread_pool_implementation,_(__gnu_cxx::_Lock_policy)2>
                             ._M_ptr);
          lVar7 = lVar14 / (long)(uVar6 << 3);
          lVar8 = 1;
          if (1 < lVar7) {
            lVar8 = lVar7;
          }
          if (0 < lVar14) {
            lVar7 = lVar8;
            lVar13 = 0;
            local_208 = lVar8;
            local_200 = ptVar5;
            local_1f8 = lVar14;
            do {
              lVar15 = lVar14;
              if (lVar7 < lVar14) {
                lVar15 = lVar7;
              }
              local_1e8 = lVar13 + lVar8;
              if (local_1e8 < lVar14) {
                lVar14 = local_1e8;
              }
              this = (ptVar5->impl).
                     super___shared_ptr<dlib::thread_pool_implementation,_(__gnu_cxx::_Lock_policy)2>
                     ._M_ptr;
              local_240._M_dataplus._M_p = (pointer)&this->m;
              local_240._M_string_length = 0;
              local_240.field_2._M_allocated_capacity = 0;
              local_1f0 = lVar7;
              pthread_mutex_lock((pthread_mutex_t *)local_240._M_dataplus._M_p);
              id = pthread_self();
              lVar8 = thread_pool_implementation::find_empty_task_slot(this);
              if ((lVar8 == -1) &&
                 (bVar3 = thread_pool_implementation::is_worker_thread(this,id), bVar3)) {
                auto_mutex::unlock((auto_mutex *)&local_240);
                lVar7 = local_1f0;
                lVar14 = local_1f8;
                ptVar5 = local_200;
                lVar8 = local_208;
                do {
                  pcVar9 = local_218;
                  if (((ulong)local_218 & 1) != 0) {
                    pcVar9 = *(code **)(local_218 + *(long *)((long)local_220 + local_210) + -1);
                  }
                  (*pcVar9)((long *)((long)local_220 + local_210),lVar13);
                  lVar13 = lVar13 + 1;
                } while (lVar15 != lVar13);
              }
              else {
                while (lVar8 == -1) {
                  pthread_cond_wait((pthread_cond_t *)&(this->task_done_signaler).cond,
                                    (pthread_mutex_t *)(this->task_done_signaler).associated_mutex);
                  lVar8 = thread_pool_implementation::find_empty_task_slot(this);
                }
                (this->tasks).array_elements[lVar8].thread_id = id;
                uVar10 = thread_pool_implementation::make_next_task_id(this,lVar8);
                ptVar1 = (this->tasks).array_elements;
                ptVar1[lVar8].task_id = uVar10;
                (*(code *)**ptVar1[lVar8].mfp2.super_mfp_kernel_1_base_class<2UL>.mp_memory.data)();
                puVar2 = (undefined8 *)
                         ptVar1[lVar8].mfp2.super_mfp_kernel_1_base_class<2UL>.mp_memory.data;
                puVar2[1] = &local_220;
                *(undefined4 *)(puVar2 + 2) = 0;
                puVar2[3] = impl::
                            helper_parallel_for<dlib::impl::helper_parallel_for_funct<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/arrufat[P]dlib-pytorch-benchmark/external/dlib/dlib/cuda/cpu_dlib.cpp:2326:58)>_>
                            ::process_block;
                puVar2[4] = 0;
                *puVar2 = &PTR__mp_base_base_001fb490;
                ptVar1 = (this->tasks).array_elements;
                ptVar1[lVar8].arg1 = lVar13;
                ptVar1[lVar8].arg2 = lVar14;
                pthread_cond_signal((pthread_cond_t *)&(this->task_ready_signaler).cond);
                lVar8 = local_208;
                lVar7 = local_1f0;
                lVar14 = local_1f8;
                ptVar5 = local_200;
              }
              auto_mutex::unlock((auto_mutex *)&local_240);
              lVar7 = lVar7 + lVar8;
              lVar13 = local_1e8;
            } while (local_1e8 < lVar14);
          }
          thread_pool_implementation::wait_for_all_tasks
                    ((ptVar5->impl).
                     super___shared_ptr<dlib::thread_pool_implementation,_(__gnu_cxx::_Lock_policy)2>
                     ._M_ptr);
        }
      }
      return;
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1c0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1c0,"\n\nError detected at line ",0x19);
    poVar11 = (ostream *)std::ostream::operator<<((ostream *)&local_1c0,0x90e);
    std::__ostream_insert<char,std::char_traits<char>>(poVar11,".\n",2);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1c0,"Error detected in file ",0x17);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1c0,
               "/workspace/llm4binary/github/license_c_cmakelists/arrufat[P]dlib-pytorch-benchmark/external/dlib/dlib/cuda/cpu_dlib.cpp"
               ,0x77);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1c0,".\n",2);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1c0,"Error detected in function ",0x1b);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1c0,
               "void dlib::cpu::resize_bilinear(tensor &, long long, long long, const tensor &, long long, long long)"
               ,0x65);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1c0,".\n\n",3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1c0,"Failing expression was ",0x17);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1c0,"dest.k() == src.k()",0x13);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1c0,".\n",2);
    *(uint *)((long)&local_1a8 + local_1c0[-3]) = *(uint *)((long)&local_1a8 + local_1c0[-3]) | 1;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1c0,"",0);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1c0,"\n",1);
    pfVar12 = (fatal_error *)__cxa_allocate_exception(0x30);
    std::__cxx11::stringbuf::str();
    fatal_error::fatal_error(pfVar12,EBROKEN_ASSERT,&local_240);
    __cxa_throw(pfVar12,&fatal_error::typeinfo,error::~error);
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1c0);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_1c0,"\n\nError detected at line ",0x19);
  poVar11 = (ostream *)std::ostream::operator<<((ostream *)&local_1c0,0x90d);
  std::__ostream_insert<char,std::char_traits<char>>(poVar11,".\n",2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_1c0,"Error detected in file ",0x17);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_1c0,
             "/workspace/llm4binary/github/license_c_cmakelists/arrufat[P]dlib-pytorch-benchmark/external/dlib/dlib/cuda/cpu_dlib.cpp"
             ,0x77);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1c0,".\n",2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_1c0,"Error detected in function ",0x1b);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_1c0,
             "void dlib::cpu::resize_bilinear(tensor &, long long, long long, const tensor &, long long, long long)"
             ,0x65);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1c0,".\n\n",3);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_1c0,"Failing expression was ",0x17);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_1c0,"dest.num_samples() == src.num_samples()",0x27);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1c0,".\n",2);
  *(uint *)((long)&local_1a8 + local_1c0[-3]) = *(uint *)((long)&local_1a8 + local_1c0[-3]) | 1;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1c0,"",0);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1c0,"\n",1);
  pfVar12 = (fatal_error *)__cxa_allocate_exception(0x30);
  std::__cxx11::stringbuf::str();
  fatal_error::fatal_error(pfVar12,EBROKEN_ASSERT,&local_240);
  __cxa_throw(pfVar12,&fatal_error::typeinfo,error::~error);
}

Assistant:

void resize_bilinear (
            tensor& dest,
            long long dest_row_stride,
            long long dest_channel_stride,
            const tensor& src,
            long long src_row_stride,
            long long src_channel_stride
        )
        {
            DLIB_CASSERT(is_same_object(dest, src)==false);
            DLIB_CASSERT(dest.num_samples() == src.num_samples());
            DLIB_CASSERT(dest.k() == src.k());

            if (dest.size() == 0 || src.size() == 0)
                return;

            const float* s = src.host();
            float* d = dest.host();

            parallel_for(0, dest.k()*dest.num_samples(), [&](long i)
            {
                auto simg = sub_image(s+i*src_channel_stride, src.nr(), src.nc(), src_row_stride);
                auto dimg = sub_image(d+i*dest_channel_stride, dest.nr(), dest.nc(), dest_row_stride);

                resize_image(simg, dimg);
            });
        }